

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_create(REF_SEARCH *ref_search_ptr,REF_INT n)

{
  REF_SEARCH pRVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  int local_38;
  int local_34;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_SEARCH ref_search;
  REF_INT n_local;
  REF_SEARCH *ref_search_ptr_local;
  
  pRVar1 = (REF_SEARCH)malloc(0x40);
  *ref_search_ptr = pRVar1;
  if (*ref_search_ptr == (REF_SEARCH)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x22,
           "ref_search_create","malloc *ref_search_ptr of REF_SEARCH_STRUCT NULL");
    ref_search_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_search_ptr;
    pRVar1->d = 3;
    pRVar1->n = n;
    pRVar1->empty = 0;
    if (pRVar1->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x29
             ,"ref_search_create","malloc ref_search->item of REF_INT negative");
      ref_search_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)pRVar1->n << 2);
      pRVar1->item = pRVar2;
      if (pRVar1->item == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x29,"ref_search_create","malloc ref_search->item of REF_INT NULL");
        ref_search_ptr_local._4_4_ = 2;
      }
      else {
        for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < pRVar1->n;
            ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
          pRVar1->item[ref_malloc_init_i_2] = -1;
        }
        if (pRVar1->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x2a,"ref_search_create","malloc ref_search->left of REF_INT negative");
          ref_search_ptr_local._4_4_ = 1;
        }
        else {
          pRVar2 = (REF_INT *)malloc((long)pRVar1->n << 2);
          pRVar1->left = pRVar2;
          if (pRVar1->left == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                   ,0x2a,"ref_search_create","malloc ref_search->left of REF_INT NULL");
            ref_search_ptr_local._4_4_ = 2;
          }
          else {
            for (ref_malloc_init_i_3 = 0; ref_malloc_init_i_3 < pRVar1->n;
                ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
              pRVar1->left[ref_malloc_init_i_3] = -1;
            }
            if (pRVar1->n < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                     ,0x2b,"ref_search_create","malloc ref_search->right of REF_INT negative");
              ref_search_ptr_local._4_4_ = 1;
            }
            else {
              pRVar2 = (REF_INT *)malloc((long)pRVar1->n << 2);
              pRVar1->right = pRVar2;
              if (pRVar1->right == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                       ,0x2b,"ref_search_create","malloc ref_search->right of REF_INT NULL");
                ref_search_ptr_local._4_4_ = 2;
              }
              else {
                for (local_34 = 0; local_34 < pRVar1->n; local_34 = local_34 + 1) {
                  pRVar1->right[local_34] = -1;
                }
                if (pRVar1->d * pRVar1->n < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                         ,0x2d,"ref_search_create","malloc ref_search->pos of REF_DBL negative");
                  ref_search_ptr_local._4_4_ = 1;
                }
                else {
                  pRVar3 = (REF_DBL *)malloc((long)(pRVar1->d * pRVar1->n) << 3);
                  pRVar1->pos = pRVar3;
                  if (pRVar1->pos == (REF_DBL *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                           ,0x2d,"ref_search_create","malloc ref_search->pos of REF_DBL NULL");
                    ref_search_ptr_local._4_4_ = 2;
                  }
                  else if (pRVar1->n < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                           ,0x2e,"ref_search_create","malloc ref_search->radius of REF_DBL negative"
                          );
                    ref_search_ptr_local._4_4_ = 1;
                  }
                  else {
                    pRVar3 = (REF_DBL *)malloc((long)pRVar1->n << 3);
                    pRVar1->radius = pRVar3;
                    if (pRVar1->radius == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                             ,0x2e,"ref_search_create","malloc ref_search->radius of REF_DBL NULL");
                      ref_search_ptr_local._4_4_ = 2;
                    }
                    else if (pRVar1->n < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                             ,0x2f,"ref_search_create",
                             "malloc ref_search->children_ball of REF_DBL negative");
                      ref_search_ptr_local._4_4_ = 1;
                    }
                    else {
                      pRVar3 = (REF_DBL *)malloc((long)pRVar1->n << 3);
                      pRVar1->children_ball = pRVar3;
                      if (pRVar1->children_ball == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                               ,0x2f,"ref_search_create",
                               "malloc ref_search->children_ball of REF_DBL NULL");
                        ref_search_ptr_local._4_4_ = 2;
                      }
                      else {
                        for (local_38 = 0; local_38 < pRVar1->n; local_38 = local_38 + 1) {
                          pRVar1->children_ball[local_38] = 0.0;
                        }
                        ref_search_ptr_local._4_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_search_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_search_create(REF_SEARCH *ref_search_ptr, REF_INT n) {
  REF_SEARCH ref_search;

  ref_malloc(*ref_search_ptr, 1, REF_SEARCH_STRUCT);
  ref_search = (*ref_search_ptr);

  ref_search->d = 3;
  ref_search->n = n;
  ref_search->empty = 0;

  ref_malloc_init(ref_search->item, ref_search->n, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_search->left, ref_search->n, REF_INT, REF_EMPTY);
  ref_malloc_init(ref_search->right, ref_search->n, REF_INT, REF_EMPTY);

  ref_malloc(ref_search->pos, ref_search->d * ref_search->n, REF_DBL);
  ref_malloc(ref_search->radius, ref_search->n, REF_DBL);
  ref_malloc_init(ref_search->children_ball, ref_search->n, REF_DBL, 0.0);

  return REF_SUCCESS;
}